

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::IsinfCase::compare(IsinfCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  int iVar2;
  pointer pSVar3;
  Float<unsigned_short,_5,_10,_15,_3U> FVar4;
  uint uVar5;
  ostream *poVar6;
  ostringstream *poVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  deUint32 u32;
  Float<unsigned_int,_8,_23,_127,_3U> local_44;
  IsinfCase *local_40;
  HexBool local_34;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar1 == PRECISION_HIGHP) {
    if (0 < (int)uVar5) {
      uVar10 = 0;
      do {
        uVar8 = *(uint *)((long)*inputs + uVar10 * 4) & 0x7fffffff;
        if ((*(int *)((long)*outputs + uVar10 * 4) == 0) == (uVar8 == 0x7f800000)) {
          poVar7 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar7->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
          poVar6 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] = ",4);
          local_34.value = (deUint32)(uVar8 == 0x7f800000);
          Functional::operator<<(poVar6,&local_34);
          return false;
        }
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
    }
  }
  else if ((PVar1 == PRECISION_MEDIUMP) && (0 < (int)uVar5)) {
    lVar9 = 0;
    local_40 = this;
    do {
      local_44.m_value = *(StorageType *)((long)*inputs + lVar9 * 4);
      iVar2 = *(int *)((long)*outputs + lVar9 * 4);
      FVar4 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>(&local_44);
      if (((FVar4.m_value & 0x7fff) != 0x7c00) && (iVar2 != 0)) {
        poVar7 = &(local_40->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar7->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar6 = (ostream *)std::ostream::operator<<(poVar7,(int)lVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] = ",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"false",5);
        return false;
      }
      lVar9 = lVar9 + 1;
    } while (uVar5 != (uint)lVar9);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP)
		{
			// Only highp is required to support inf/nan
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float32(in0).isInf();

				if (out0 != ref)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexBool(ref);
					return false;
				}
			}
		}
		else if (precision == glu::PRECISION_MEDIUMP)
		{
			// Inf support is optional, check that inputs that are not Inf in mediump don't result in true.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float16(in0).isInf();

				if (!ref && out0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << (ref ? "true" : "false");
					return false;
				}
			}
		}
		// else: no verification can be performed

		return true;
	}